

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::banCheck(Server *this,PlayerInfo *player)

{
  uint uVar1;
  pointer puVar2;
  long lVar3;
  uint64_t uVar4;
  size_type __pos;
  __type _Var5;
  bool bVar6;
  char cVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  size_t index;
  long lVar11;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *pvVar12;
  size_type sVar13;
  tm *ptVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 *puVar17;
  PlayerInfo *extraout_RDX;
  PlayerInfo *player_00;
  PlayerInfo *extraout_RDX_00;
  PlayerInfo *extraout_RDX_01;
  PlayerInfo *extraout_RDX_02;
  PlayerInfo *extraout_RDX_03;
  PlayerInfo *extraout_RDX_04;
  PlayerInfo *extraout_RDX_05;
  PlayerInfo *extraout_RDX_06;
  PlayerInfo *extraout_RDX_07;
  PlayerInfo *extraout_RDX_08;
  PlayerInfo *extraout_RDX_09;
  PlayerInfo *extraout_RDX_10;
  PlayerInfo *extraout_RDX_11;
  PlayerInfo *extraout_RDX_12;
  PlayerInfo *extraout_RDX_13;
  PlayerInfo *extraout_RDX_14;
  PlayerInfo *extraout_RDX_15;
  PlayerInfo *extraout_RDX_16;
  pointer puVar18;
  Entry *pEVar19;
  long *plVar20;
  long *plVar21;
  undefined1 auVar22 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar23;
  string_view reason;
  string_view message;
  string_view reason_00;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string fmtName;
  ulong local_1d8;
  time_t current_time;
  size_type local_1c0;
  Entry *last_to_expire [7];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  string channel_message;
  anon_class_8_1_fa0fe738 handle_type;
  char timeStr [256];
  
  if ((player->exemption_flags & 6) == 0) {
    for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
      last_to_expire[lVar11] = (Entry *)0x0;
    }
    handle_type.last_to_expire = &last_to_expire;
    pvVar12 = BanDatabase::getEntries((BanDatabase *)banDatabase);
    puVar2 = (pvVar12->
             super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    player_00 = extraout_RDX;
    for (puVar18 = (pvVar12->
                   super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar2;
        puVar18 = puVar18 + 1) {
      pEVar19 = (puVar18->_M_t).
                super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                ._M_t.
                super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
      if ((short)pEVar19->flags < 0) {
        lVar11 = (pEVar19->length).__r;
        if (lVar11 != 0) {
          lVar3 = (pEVar19->timestamp).__d.__r;
          auVar22 = std::chrono::_V2::system_clock::now();
          player_00 = auVar22._8_8_;
          pEVar19 = (puVar18->_M_t).
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
          if (lVar11 * 1000000000 + lVar3 < auVar22._0_8_) {
            BanDatabase::deactivate((BanDatabase *)banDatabase,pEVar19);
            player_00 = extraout_RDX_00;
            goto LAB_0013c419;
          }
        }
        uVar9 = 0xffffffff;
        if (pEVar19->prefix_length < 0x20) {
          uVar9 = Jupiter_prefix_length_to_netmask(pEVar19->prefix_length);
          player_00 = extraout_RDX_01;
        }
        if (((((this->m_localSteamBan != true) ||
              (uVar4 = ((puVar18->_M_t).
                        super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                        .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl)->
                       steamid, uVar4 == 0)) || (uVar4 != player->steamid)) &&
            (((this->m_localIPBan != true ||
              (uVar1 = ((puVar18->_M_t).
                        super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                        .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl)->ip,
              uVar1 == 0)) || (((uVar1 ^ player->ip32) & uVar9) != 0)))) &&
           (((this->m_localHWIDBan != true ||
             (pEVar19 = (puVar18->_M_t).
                        super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                        .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
             (pEVar19->hwid)._M_string_length == 0)) ||
            (_Var5 = std::operator==(&pEVar19->hwid,&player->hwid), player_00 = extraout_RDX_02,
            !_Var5)))) {
          if (((this->m_localRDNSBan == true) &&
              (pEVar19 = (puVar18->_M_t).
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
              (pEVar19->rdns)._M_string_length != 0)) && ((pEVar19->flags & 0x4000) != 0)) {
            timeStr._0_16_ = (undefined1  [16])PlayerInfo::get_rdns(player);
            pEVar19 = (puVar18->_M_t).
                      super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                      .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
            sVar13 = std::basic_string_view<char,_std::char_traits<char>_>::find
                               ((basic_string_view<char,_std::char_traits<char>_> *)timeStr,
                                (pEVar19->rdns)._M_dataplus._M_p,0,(pEVar19->rdns)._M_string_length)
            ;
            player_00 = extraout_RDX_03;
            if (sVar13 != 0xffffffffffffffff) goto LAB_0013c567;
          }
          if (((this->m_localNameBan != true) ||
              (pEVar19 = (puVar18->_M_t).
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
              (pEVar19->name)._M_string_length == 0)) ||
             (bVar6 = jessilib::equalsi<char,char>(&pEVar19->name,&player->name),
             player_00 = extraout_RDX_04, !bVar6)) goto LAB_0013c419;
        }
LAB_0013c567:
        pEVar19 = (puVar18->_M_t).
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
        uVar8 = pEVar19->flags;
        player->ban_flags = player->ban_flags | uVar8;
        if ((char)uVar8 < '\0') {
          banCheck::anon_class_8_1_fa0fe738::operator()(&handle_type,pEVar19,0);
          pEVar19 = (puVar18->_M_t).
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
          uVar8 = pEVar19->flags;
          player_00 = extraout_RDX_05;
        }
        if ((uVar8 & 0x40) != 0) {
          banCheck::anon_class_8_1_fa0fe738::operator()(&handle_type,pEVar19,1);
          pEVar19 = (puVar18->_M_t).
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
          uVar8 = pEVar19->flags;
          player_00 = extraout_RDX_06;
        }
        if ((uVar8 & 0x20) != 0) {
          banCheck::anon_class_8_1_fa0fe738::operator()(&handle_type,pEVar19,2);
          pEVar19 = (puVar18->_M_t).
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
          uVar8 = pEVar19->flags;
          player_00 = extraout_RDX_07;
        }
        if ((uVar8 & 0x10) != 0) {
          banCheck::anon_class_8_1_fa0fe738::operator()(&handle_type,pEVar19,3);
          pEVar19 = (puVar18->_M_t).
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
          uVar8 = pEVar19->flags;
          player_00 = extraout_RDX_08;
        }
        if ((uVar8 & 8) != 0) {
          banCheck::anon_class_8_1_fa0fe738::operator()(&handle_type,pEVar19,4);
          pEVar19 = (puVar18->_M_t).
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
          uVar8 = pEVar19->flags;
          player_00 = extraout_RDX_09;
        }
        if ((uVar8 & 4) != 0) {
          banCheck::anon_class_8_1_fa0fe738::operator()(&handle_type,pEVar19,5);
          pEVar19 = (puVar18->_M_t).
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
          uVar8 = pEVar19->flags;
          player_00 = extraout_RDX_10;
        }
        if ((uVar8 & 2) != 0) {
          banCheck::anon_class_8_1_fa0fe738::operator()(&handle_type,pEVar19,6);
          player_00 = extraout_RDX_11;
        }
      }
LAB_0013c419:
    }
    if (last_to_expire[0] == (Entry *)0x0) {
      if (last_to_expire[1] == (Entry *)0x0) {
        if (last_to_expire[2] != (Entry *)0x0) {
          current_time = ((last_to_expire[2]->length).__r * 1000000000 +
                         (last_to_expire[2]->timestamp).__d.__r) / 1000000000;
          ptVar14 = localtime(&current_time);
          strftime(timeStr,0x100,"%b %d %Y at %H:%M:%S",ptVar14);
          if ((last_to_expire[2]->length).__r == 0) {
            string_printf_abi_cxx11_
                      (&fmtName,"You were permanently bot-muted from %.*s on %s for: %.*s",
                       (this->m_ban_from_str)._M_string_length,
                       (this->m_ban_from_str)._M_dataplus._M_p,timeStr,
                       (last_to_expire[2]->reason)._M_string_length,
                       (last_to_expire[2]->reason)._M_dataplus._M_p);
            message_02._M_str = fmtName._M_dataplus._M_p;
            message_02._M_len = fmtName._M_string_length;
            sendMessage(this,player,message_02);
          }
          else {
            string_printf_abi_cxx11_
                      (&fmtName,"You are bot-muted from %.*s until %s for: %.*s",
                       (this->m_ban_from_str)._M_string_length,
                       (this->m_ban_from_str)._M_dataplus._M_p,timeStr,
                       (last_to_expire[2]->reason)._M_string_length,
                       (last_to_expire[2]->reason)._M_dataplus._M_p);
            message_00._M_str = fmtName._M_dataplus._M_p;
            message_00._M_len = fmtName._M_string_length;
            sendMessage(this,player,message_00);
          }
          std::__cxx11::string::~string((string *)&fmtName);
          player_00 = extraout_RDX_13;
        }
      }
      else {
        current_time = ((last_to_expire[1]->length).__r * 1000000000 +
                       (last_to_expire[1]->timestamp).__d.__r) / 1000000000;
        ptVar14 = localtime(&current_time);
        strftime(timeStr,0x100,"%b %d %Y at %H:%M:%S",ptVar14);
        mute(this,player);
        if ((last_to_expire[1]->length).__r == 0) {
          string_printf_abi_cxx11_
                    (&fmtName,"You were permanently muted from %.*s on %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[1]->reason)._M_string_length,
                     (last_to_expire[1]->reason)._M_dataplus._M_p);
          message_01._M_str = fmtName._M_dataplus._M_p;
          message_01._M_len = fmtName._M_string_length;
          sendMessage(this,player,message_01);
        }
        else {
          string_printf_abi_cxx11_
                    (&fmtName,"You are muted from %.*s until %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[1]->reason)._M_string_length,
                     (last_to_expire[1]->reason)._M_dataplus._M_p);
          message._M_str = fmtName._M_dataplus._M_p;
          message._M_len = fmtName._M_string_length;
          sendMessage(this,player,message);
        }
        std::__cxx11::string::~string((string *)&fmtName);
        *(byte *)&player->ban_flags = (byte)player->ban_flags | 0x20;
        player_00 = extraout_RDX_12;
      }
      if (last_to_expire[3] != (Entry *)0x0) {
        current_time = ((last_to_expire[3]->length).__r * 1000000000 +
                       (last_to_expire[3]->timestamp).__d.__r) / 1000000000;
        ptVar14 = localtime(&current_time);
        strftime(timeStr,0x100,"%b %d %Y at %H:%M:%S",ptVar14);
        if ((last_to_expire[3]->length).__r == 0) {
          string_printf_abi_cxx11_
                    (&fmtName,"You were permanently vote-muted from %.*s on %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[3]->reason)._M_string_length,
                     (last_to_expire[3]->reason)._M_dataplus._M_p);
          message_04._M_str = fmtName._M_dataplus._M_p;
          message_04._M_len = fmtName._M_string_length;
          sendMessage(this,player,message_04);
        }
        else {
          string_printf_abi_cxx11_
                    (&fmtName,"You are vote-muted from %.*s until %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[3]->reason)._M_string_length,
                     (last_to_expire[3]->reason)._M_dataplus._M_p);
          message_03._M_str = fmtName._M_dataplus._M_p;
          message_03._M_len = fmtName._M_string_length;
          sendMessage(this,player,message_03);
        }
        std::__cxx11::string::~string((string *)&fmtName);
        player_00 = extraout_RDX_14;
      }
      if (last_to_expire[4] != (Entry *)0x0) {
        current_time = ((last_to_expire[4]->length).__r * 1000000000 +
                       (last_to_expire[4]->timestamp).__d.__r) / 1000000000;
        mineBan(this,player);
        ptVar14 = localtime(&current_time);
        strftime(timeStr,0x100,"%b %d %Y at %H:%M:%S",ptVar14);
        if ((last_to_expire[4]->length).__r == 0) {
          string_printf_abi_cxx11_
                    (&fmtName,"You were permanently mine-banned from %.*s on %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[4]->reason)._M_string_length,
                     (last_to_expire[4]->reason)._M_dataplus._M_p);
          message_06._M_str = fmtName._M_dataplus._M_p;
          message_06._M_len = fmtName._M_string_length;
          sendMessage(this,player,message_06);
        }
        else {
          string_printf_abi_cxx11_
                    (&fmtName,"You are mine-banned from %.*s until %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[4]->reason)._M_string_length,
                     (last_to_expire[4]->reason)._M_dataplus._M_p);
          message_05._M_str = fmtName._M_dataplus._M_p;
          message_05._M_len = fmtName._M_string_length;
          sendMessage(this,player,message_05);
        }
        std::__cxx11::string::~string((string *)&fmtName);
        player_00 = extraout_RDX_15;
      }
      if (last_to_expire[5] != (Entry *)0x0) {
        current_time = ((last_to_expire[5]->length).__r * 1000000000 +
                       (last_to_expire[5]->timestamp).__d.__r) / 1000000000;
        ptVar14 = localtime(&current_time);
        strftime(timeStr,0x100,"%b %d %Y at %H:%M:%S",ptVar14);
        if ((last_to_expire[5]->length).__r == 0) {
          string_printf_abi_cxx11_
                    (&fmtName,"You were permanently ladder-banned from %.*s on %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[5]->reason)._M_string_length,
                     (last_to_expire[5]->reason)._M_dataplus._M_p);
          message_08._M_str = fmtName._M_dataplus._M_p;
          message_08._M_len = fmtName._M_string_length;
          sendMessage(this,player,message_08);
        }
        else {
          string_printf_abi_cxx11_
                    (&fmtName,"You are ladder-banned from %.*s until %s for: %.*s",
                     (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p
                     ,timeStr,(last_to_expire[5]->reason)._M_string_length,
                     (last_to_expire[5]->reason)._M_dataplus._M_p);
          message_07._M_str = fmtName._M_dataplus._M_p;
          message_07._M_len = fmtName._M_string_length;
          sendMessage(this,player,message_07);
        }
        std::__cxx11::string::~string((string *)&fmtName);
        player_00 = extraout_RDX_16;
      }
      if (last_to_expire[6] != (Entry *)0x0) {
        getFormattedPlayerName_abi_cxx11_(&fmtName,(RenX *)player,player_00);
        string_printf_abi_cxx11_
                  ((string *)&current_time,
                   "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in "
                   ,fmtName._M_string_length,fmtName._M_dataplus._M_p,
                   (last_to_expire[6]->banner)._M_string_length,
                   (last_to_expire[6]->banner)._M_dataplus._M_p,
                   (last_to_expire[6]->reason)._M_string_length,
                   (last_to_expire[6]->reason)._M_dataplus._M_p);
        string_printf_abi_cxx11_
                  (&channel_message,
                   "\x0304[Alert] \x03\x02%.*s\x02\x03 is marked for monitoring by %.*s for: \"%.*s\".\x03"
                   ,fmtName._M_string_length,fmtName._M_dataplus._M_p,
                   (last_to_expire[6]->banner)._M_string_length,
                   (last_to_expire[6]->banner)._M_dataplus._M_p,
                   (last_to_expire[6]->reason)._M_string_length,
                   (last_to_expire[6]->reason)._M_dataplus._M_p);
        local_1d8 = 0;
        while( true ) {
          uVar15 = ServerManager::size();
          if (uVar15 <= local_1d8) break;
          uVar16 = ServerManager::getServer(_serverManager);
          lVar11 = Jupiter::IRC::Client::getChannels_abi_cxx11_();
          plVar21 = (long *)(lVar11 + 0x10);
          while (plVar21 = (long *)*plVar21, plVar21 != (long *)0x0) {
            iVar10 = Jupiter::IRC::Client::Channel::getType();
            if (this->m_adminLogChanType == iVar10) {
              auVar22 = Jupiter::IRC::Client::Channel::getName();
              Jupiter::IRC::Client::sendMessage
                        (uVar16,auVar22._0_8_,auVar22._8_8_,channel_message._M_string_length,
                         channel_message._M_dataplus._M_p);
              __pos = local_1c0;
              bVar23 = (basic_string_view<char,_std::char_traits<char>_>)
                       Jupiter::IRC::Client::Channel::getName();
              local_170 = bVar23;
              std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)&current_time,&local_170);
              lVar11 = Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
              plVar20 = (long *)(lVar11 + 0x10);
              while (plVar20 = (long *)*plVar20, plVar20 != (long *)0x0) {
                cVar7 = Jupiter::IRC::Client::Channel::getUserPrefix((User *)(plVar21 + 5));
                if (cVar7 != '\0') {
                  bVar23 = (basic_string_view<char,_std::char_traits<char>_>)
                           Jupiter::IRC::Client::getNickname();
                  puVar17 = (undefined8 *)
                            Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_();
                  __y._M_str = (char *)*puVar17;
                  __y._M_len = puVar17[1];
                  bVar6 = std::operator==(bVar23,__y);
                  if (!bVar6) {
                    Jupiter::IRC::Client::Channel::User::getUser();
                    puVar17 = (undefined8 *)Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
                    Jupiter::IRC::Client::sendMessage
                              (uVar16,puVar17[1],*puVar17,local_1c0,current_time);
                  }
                }
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &current_time,__pos,0xffffffffffffffff);
            }
          }
          local_1d8 = local_1d8 + 1;
        }
        std::__cxx11::string::~string((string *)&channel_message);
        std::__cxx11::string::~string((string *)&current_time);
        std::__cxx11::string::~string((string *)&fmtName);
      }
    }
    else {
      current_time = ((last_to_expire[0]->length).__r * 1000000000 +
                     (last_to_expire[0]->timestamp).__d.__r) / 1000000000;
      ptVar14 = localtime(&current_time);
      strftime(timeStr,0x100,"%b %d %Y at %H:%M:%S",ptVar14);
      if ((last_to_expire[0]->length).__r == 0) {
        string_printf_abi_cxx11_
                  (&fmtName,"You were permanently banned from %.*s on %s for: %.*s",
                   (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p,
                   timeStr,(last_to_expire[0]->reason)._M_string_length,
                   (last_to_expire[0]->reason)._M_dataplus._M_p);
        reason_00._M_str = fmtName._M_dataplus._M_p;
        reason_00._M_len = fmtName._M_string_length;
        forceKickPlayer(this,player,reason_00);
      }
      else {
        string_printf_abi_cxx11_
                  (&fmtName,"You are banned from %.*s until %s for: %.*s",
                   (this->m_ban_from_str)._M_string_length,(this->m_ban_from_str)._M_dataplus._M_p,
                   timeStr,(last_to_expire[0]->reason)._M_string_length,
                   (last_to_expire[0]->reason)._M_dataplus._M_p);
        reason._M_str = fmtName._M_dataplus._M_p;
        reason._M_len = fmtName._M_string_length;
        forceKickPlayer(this,player,reason);
      }
      std::__cxx11::string::~string((string *)&fmtName);
      *(byte *)&player->ban_flags = (byte)player->ban_flags | 0x20;
    }
  }
  return;
}

Assistant:

void RenX::Server::banCheck(RenX::PlayerInfo &player) {
	if ((player.exemption_flags & (RenX::ExemptionDatabase::Entry::FLAG_TYPE_BAN | RenX::ExemptionDatabase::Entry::FLAG_TYPE_KICK)) != 0) {
		return;
	}

	uint32_t netmask;

	RenX::BanDatabase::Entry* last_to_expire[7]; // TODO: what the fuck is this?
	for (size_t index = 0; index != sizeof(last_to_expire) / sizeof(RenX::BanDatabase::Entry *); ++index)
		last_to_expire[index] = nullptr;

	auto handle_type = [&last_to_expire](RenX::BanDatabase::Entry* entry, size_t index) {
		if (last_to_expire[index] == nullptr) {
			last_to_expire[index] = entry;
		}
		else if (last_to_expire[index]->length == std::chrono::seconds::zero()) {
			// favor older bans if they're also permanent
			if (entry->length == std::chrono::seconds::zero() && entry->timestamp < last_to_expire[index]->timestamp) {
				last_to_expire[index] = entry;
			}
		}
		else if (entry->length == std::chrono::seconds::zero() || entry->timestamp + entry->length > last_to_expire[index]->timestamp + last_to_expire[index]->length) {
			last_to_expire[index] = entry;
		}
	};

	for (const auto& entry : RenX::banDatabase->getEntries()) {
		if (entry->is_active()) {
			if (entry->length != std::chrono::seconds::zero() && entry->timestamp + entry->length < std::chrono::system_clock::now()) {
				banDatabase->deactivate(entry.get());
			}
			else {
				if (entry->prefix_length >= 32) {
					netmask = 0xFFFFFFFF;
				}
				else {
					netmask = Jupiter_prefix_length_to_netmask(entry->prefix_length);
				}

				if ((m_localSteamBan && entry->steamid != 0 && entry->steamid == player.steamid)
					|| (m_localIPBan && entry->ip != 0 && (entry->ip & netmask) == (player.ip32 & netmask))
					|| (m_localHWIDBan && !entry->hwid.empty() && entry->hwid == player.hwid)
					|| (m_localRDNSBan && !entry->rdns.empty() && entry->is_rdns_ban() && player.get_rdns().find(entry->rdns) != std::string::npos)
					|| (m_localNameBan && !entry->name.empty() && jessilib::equalsi(entry->name, player.name))) {
					player.ban_flags |= entry->flags;
					if (entry->is_type_game())
						handle_type(entry.get(), 0);
					if (entry->is_type_chat())
						handle_type(entry.get(), 1);
					if (entry->is_type_bot())
						handle_type(entry.get(), 2);
					if (entry->is_type_vote())
						handle_type(entry.get(), 3);
					if (entry->is_type_mine())
						handle_type(entry.get(), 4);
					if (entry->is_type_ladder())
						handle_type(entry.get(), 5);
					if (entry->is_type_alert())
						handle_type(entry.get(), 6);
				}
			}
		}
	}

	char timeStr[256];
	if (last_to_expire[0] != nullptr) { // Game ban
		time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[0]->timestamp + last_to_expire[0]->length);
		strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
		if (last_to_expire[0]->length == std::chrono::seconds::zero()) {
			forceKickPlayer(player, string_printf("You were permanently banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}
		else {
			forceKickPlayer(player, string_printf("You are banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
				m_ban_from_str.data(), timeStr, last_to_expire[0]->reason.size(), last_to_expire[0]->reason.data()));
		}

		player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
	}
	else {
		if (last_to_expire[1] != nullptr) { // Chat ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[1]->timestamp + last_to_expire[1]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			mute(player);
			if (last_to_expire[1]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));
			else
				sendMessage(player, string_printf("You are muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[1]->reason.size(), last_to_expire[1]->reason.data()));

			player.ban_flags |= RenX::BanDatabase::Entry::FLAG_TYPE_BOT; // implies FLAG_TYPE_BOT
		}
		else if (last_to_expire[2] != nullptr) { // Bot ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[2]->timestamp + last_to_expire[2]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[2]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently bot-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
			else
				sendMessage(player, string_printf("You are bot-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[2]->reason.size(), last_to_expire[2]->reason.data()));
		}
		if (last_to_expire[3] != nullptr) { // Vote ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[3]->timestamp + last_to_expire[3]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[3]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently vote-muted from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
			else
				sendMessage(player, string_printf("You are vote-muted from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[3]->reason.size(), last_to_expire[3]->reason.data()));
		}
		if (last_to_expire[4] != nullptr) { // Mine ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[4]->timestamp + last_to_expire[4]->length);
			mineBan(player);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[4]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently mine-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
			else
				sendMessage(player, string_printf("You are mine-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[4]->reason.size(), last_to_expire[4]->reason.data()));
		}
		if (last_to_expire[5] != nullptr) { // Ladder ban
			time_t current_time = std::chrono::system_clock::to_time_t(last_to_expire[5]->timestamp + last_to_expire[5]->length);
			strftime(timeStr, sizeof(timeStr), "%b %d %Y at %H:%M:%S", localtime(&current_time));
			if (last_to_expire[5]->length == std::chrono::seconds::zero())
				sendMessage(player, string_printf("You were permanently ladder-banned from %.*s on %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
			else
				sendMessage(player, string_printf("You are ladder-banned from %.*s until %s for: %.*s", m_ban_from_str.size(),
					m_ban_from_str.data(), timeStr, last_to_expire[5]->reason.size(), last_to_expire[5]->reason.data()));
		}
		if (last_to_expire[6] != nullptr) { // Alert
			IRC_Bot *server;
			std::string fmtName = RenX::getFormattedPlayerName(player);
			std::string user_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\". Please keep an eye on them in ", fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());
			std::string channel_message = string_printf(IRCCOLOR "04[Alert] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR " is marked for monitoring by %.*s for: \"%.*s\"." IRCCOLOR, fmtName.size(),
				fmtName.data(), last_to_expire[6]->banner.size(), last_to_expire[6]->banner.data(), last_to_expire[6]->reason.size(), last_to_expire[6]->reason.data());

			for (size_t server_index = 0; server_index < serverManager->size(); ++server_index) {
				server = serverManager->getServer(server_index);
				for (auto& channel : server->getChannels()) {
					if (isAdminLogChanType(channel.second.getType())) {
						server->sendMessage(channel.second.getName(), channel_message);

						size_t base_length = user_message.size();
						user_message += channel.second.getName();
						for (auto& user : channel.second.getUsers()) {
							if (channel.second.getUserPrefix(*user.second) != 0 && user.second->getNickname() != server->getNickname())
								server->sendMessage(user.second->getUser()->getNickname(), user_message);
						}
						user_message.erase(base_length);
					}
				}
			}
		}
	}
}